

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.h
# Opt level: O0

optional<Kernel::RealConstantType> * __thiscall
viras::
Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>
::tryNumeral(Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>
             *this,Term t)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>
  *in_RDI;
  
  Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>
  ::
  matchTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>::tryNumeral(Kernel::TermList)::_lambda(auto:1)_1_,viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>::tryNumeral(Kernel::TermList)::_lambda()_1_,viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>::tryNumeral(Kernel::TermList)::_lambda(auto:1,auto:2)_1_,viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>::tryNumeral(Kernel::TermList)::_lambda(auto:1,auto:2)_2_,viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>::tryNumeral(Kernel::TermList)::_lambda(auto:1)_2_>
            (in_RDI,in_RSI,in_RDX,in_RSI,in_RSI);
  return (optional<Kernel::RealConstantType> *)in_RDI;
}

Assistant:

std::optional<Numeral> tryNumeral(Term t) { 
      return matchTerm(t, 
        /* var v */ [&](auto y) { return std::optional<Numeral>(); }, 
        /* numeral 1 */ [&]() { return std::optional<Numeral>(numeral(1)); }, 
        /* k * t */ [&](auto k, auto t) { 
          return isOne(t) ? std::optional<Numeral>(k)
                          : std::optional<Numeral>();
        }, 
        /* l + r */ [&](auto l, auto r) { return std::optional<Numeral>(); }, 
        /* floor */ [&](auto t) { return std::optional<Numeral>(); }); 
    }